

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexHashMap.h
# Opt level: O1

bool __thiscall Ptex::v2_2::StringKey::matches(StringKey *this,StringKey *key)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  
  if (((key->_hash == this->_hash) && (key->_len == this->_len)) && (this->_val != (char *)0x0)) {
    uVar1 = this->_len & 0xfffffff8;
    if (0 < (int)uVar1) {
      uVar3 = 0;
      do {
        if (*(long *)(key->_val + uVar3) != *(long *)(this->_val + uVar3)) {
          return false;
        }
        uVar3 = uVar3 + 8;
      } while (uVar3 < uVar1);
    }
    iVar2 = bcmp(key->_val + (int)uVar1,this->_val + (int)uVar1,(ulong)(this->_len & 7));
    return iVar2 == 0;
  }
  return false;
}

Assistant:

bool matches(const StringKey& key) volatile
    {
        return key._hash == _hash && key._len == _len && _val && 0 == memCompare(key._val, _val, _len);
    }